

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Partial_Test::
~EncodeDecodeTest_Partial_Test(EncodeDecodeTest_Partial_Test *this)

{
  EncodeDecodeTest::~EncodeDecodeTest(&this->super_EncodeDecodeTest);
  operator_delete(this,0xb0);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Partial) {
  RedirectStdinFromText("");
  EXPECT_TRUE(
      Run("google/protobuf/unittest.proto"
          " --encode=proto2_unittest.TestRequired"));
  ExpectStdoutMatchesText("");
  ExpectWarning("warning:  Input message is missing required fields:  a, b, c");
}